

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sieve.hpp
# Opt level: O3

void __thiscall
primecount::Sieve::pre_sieve<int>
          (Sieve *this,Vector<int,_std::allocator<int>_> *primes,uint64_t c,uint64_t low,
          uint64_t high)

{
  uint64_t i;
  
  reset_sieve(this,low,high);
  if (3 < c) {
    i = 4;
    do {
      cross_off(this,(long)primes->array_[i],i);
      i = i + 1;
    } while (i <= c);
  }
  init_counter(this,low,high);
  return;
}

Assistant:

void pre_sieve(const Vector<T>& primes, uint64_t c, uint64_t low, uint64_t high)
  {
    reset_sieve(low, high);
    for (uint64_t i = 4; i <= c; i++)
      cross_off(primes[i], i);

    init_counter(low, high);
  }